

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall BuildTokenTest::TearDown(BuildTokenTest *this)

{
  testing::Test::Check
            (g_current_test,
             ((long)(this->token_command_runner_).acquire_token_.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish.super__Bit_iterator_base._M_p -
             (long)(this->token_command_runner_).acquire_token_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p) * 8 +
             (ulong)*(uint *)((long)&(this->token_command_runner_).acquire_token_.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8
                             ) == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1010,"0u == token_command_runner_.acquire_token_.size()");
  testing::Test::Check
            (g_current_test,
             ((long)(this->token_command_runner_).can_run_more_.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish.super__Bit_iterator_base._M_p -
             (long)(this->token_command_runner_).can_run_more_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p) * 8 +
             (ulong)*(uint *)((long)&(this->token_command_runner_).can_run_more_.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8
                             ) == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1011,"0u == token_command_runner_.can_run_more_.size()");
  testing::Test::Check
            (g_current_test,
             ((long)(this->token_command_runner_).wait_for_command_.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish.super__Bit_iterator_base._M_p -
             (long)(this->token_command_runner_).wait_for_command_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p) * 8 +
             (ulong)*(uint *)((long)&(this->token_command_runner_).wait_for_command_.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8
                             ) == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1012,"0u == token_command_runner_.wait_for_command_.size()");
  return;
}

Assistant:

void BuildTokenTest::TearDown() {
  EXPECT_EQ(0u, token_command_runner_.acquire_token_.size());
  EXPECT_EQ(0u, token_command_runner_.can_run_more_.size());
  EXPECT_EQ(0u, token_command_runner_.wait_for_command_.size());

  BuildTest::TearDown();
}